

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

bool LoadCertificate(UniquePtr<X509> *out_x509,UniquePtr<struct_stack_st_X509> *out_chain,
                    string *file)

{
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar1;
  int iVar2;
  BIO_METHOD *type;
  X509 *__p;
  OPENSSL_STACK *__p_00;
  _Head_base<0UL,_x509_st_*,_false> _Var3;
  ulong uVar4;
  bool bVar5;
  UniquePtr<X509> cert;
  UniquePtr<BIO> bio;
  __uniq_ptr_impl<x509_st,_bssl::internal::Deleter> local_38;
  _Head_base<0UL,_bio_st_*,_false> local_30;
  _Head_base<0UL,_x509_st_*,_false> local_28;
  
  type = BIO_s_file();
  local_30._M_head_impl = (bio_st *)BIO_new(type);
  if (((BIO *)local_30._M_head_impl != (BIO *)0x0) &&
     (iVar2 = BIO_read_filename(local_30._M_head_impl,(file->_M_dataplus)._M_p), iVar2 != 0)) {
    __p = PEM_read_bio_X509((BIO *)local_30._M_head_impl,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0)
    ;
    std::__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter> *)out_x509,(pointer)__p);
    if ((out_x509->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl != (x509_st *)0x0) {
      __p_00 = OPENSSL_sk_new_null();
      std::__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter> *)out_chain,
                 (pointer)__p_00);
      if ((out_chain->_M_t).super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl != (stack_st_X509 *)0x0) {
        do {
          _Var3._M_head_impl =
               (x509_st *)
               PEM_read_bio_X509((BIO *)local_30._M_head_impl,(X509 **)0x0,(undefined1 *)0x0,
                                 (void *)0x0);
          if ((_Head_base<0UL,_x509_st_*,_false>)_Var3._M_head_impl ==
              (_Head_base<0UL,_x509_st_*,_false>)0x0) {
            local_38._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (tuple<x509_st_*,_bssl::internal::Deleter>)
                 (tuple<x509_st_*,_bssl::internal::Deleter>)_Var3._M_head_impl;
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
            uVar4 = ERR_peek_last_error();
            if (((uint)uVar4 & 0xff000fff) == 0x900006e) {
              bVar5 = true;
              ERR_clear_error();
              goto LAB_00129c03;
            }
            break;
          }
          local_38._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
               (tuple<x509_st_*,_bssl::internal::Deleter>)
               (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)0x0;
          local_28._M_head_impl = _Var3._M_head_impl;
          eVar1 = bssl::PushToStack<stack_st_X509>
                            ((out_chain->_M_t).
                             super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,
                             (UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> *)
                             &local_28);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_28);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
        } while (eVar1);
      }
    }
  }
  bVar5 = false;
LAB_00129c03:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_30);
  return bVar5;
}

Assistant:

bool LoadCertificate(bssl::UniquePtr<X509> *out_x509,
                     bssl::UniquePtr<STACK_OF(X509)> *out_chain,
                     const std::string &file) {
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_file()));
  if (!bio || !BIO_read_filename(bio.get(), file.c_str())) {
    return false;
  }

  out_x509->reset(PEM_read_bio_X509(bio.get(), nullptr, nullptr, nullptr));
  if (!*out_x509) {
    return false;
  }

  out_chain->reset(sk_X509_new_null());
  if (!*out_chain) {
    return false;
  }

  // Keep reading the certificate chain.
  for (;;) {
    bssl::UniquePtr<X509> cert(
        PEM_read_bio_X509(bio.get(), nullptr, nullptr, nullptr));
    if (!cert) {
      break;
    }

    if (!bssl::PushToStack(out_chain->get(), std::move(cert))) {
      return false;
    }
  }

  uint32_t err = ERR_peek_last_error();
  if (ERR_GET_LIB(err) != ERR_LIB_PEM ||
      ERR_GET_REASON(err) != PEM_R_NO_START_LINE) {
    return false;
  }

  ERR_clear_error();
  return true;
}